

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_add(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  size_t i;
  mbedtls_mpi_uint mVar2;
  
  mVar2 = 0;
  for (i = 0; limbs != i; i = i + 1) {
    uVar1 = mVar2 + A[i];
    mVar2 = (ulong)CARRY8(uVar1,B[i]) + (ulong)CARRY8(mVar2,A[i]);
    X[i] = uVar1 + B[i];
  }
  return mVar2;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint t = c + A[i];
        c = (t < A[i]);
        t += B[i];
        c += (t < B[i]);
        X[i] = t;
    }

    return c;
}